

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

int i2d_ASN1_OBJECT(ASN1_OBJECT *a,uchar **pp)

{
  int iVar1;
  undefined1 local_80 [8];
  CBB child;
  CBB cbb;
  uchar **outp_local;
  ASN1_OBJECT *in_local;
  
  if (a == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0xc,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0x20);
  }
  else if (a->length < 1) {
    ERR_put_error(0xc,0,0x86,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0x25);
  }
  else {
    iVar1 = CBB_init((CBB *)((long)&child.u + 0x18),(long)a->length + 2);
    if (((iVar1 != 0) &&
        (iVar1 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)local_80,6), iVar1 != 0)) &&
       (iVar1 = CBB_add_bytes((CBB *)local_80,a->data,(long)a->length), iVar1 != 0)) {
      iVar1 = CBB_finish_i2d((CBB *)((long)&child.u + 0x18),pp);
      return iVar1;
    }
    CBB_cleanup((CBB *)((long)&child.u + 0x18));
  }
  return -1;
}

Assistant:

int i2d_ASN1_OBJECT(const ASN1_OBJECT *in, unsigned char **outp) {
  if (in == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_PASSED_NULL_PARAMETER);
    return -1;
  }

  if (in->length <= 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
    return -1;
  }

  CBB cbb, child;
  if (!CBB_init(&cbb, (size_t)in->length + 2) ||
      !CBB_add_asn1(&cbb, &child, CBS_ASN1_OBJECT) ||
      !CBB_add_bytes(&child, in->data, in->length)) {
    CBB_cleanup(&cbb);
    return -1;
  }

  return CBB_finish_i2d(&cbb, outp);
}